

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall
fasttext::FastText::cbow
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  int factor;
  element_type *peVar1;
  pointer piVar2;
  result_type_conflict1 rVar3;
  uint uVar4;
  vector<int,_std::allocator<int>_> *__x;
  int iVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  vector<int,_std::allocator<int>_> bow;
  vector<int,_std::allocator<int>_> ngramsmod;
  uniform_int_distribution<int> uniform;
  vector<int,_std::allocator<int>_> local_88;
  FastText *local_68;
  vector<int,_std::allocator<int>_> local_60;
  uniform_int_distribution<int> local_48;
  State *local_40;
  minstd_rand *local_38;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_12_ =
       ZEXT812(0);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48._M_param._M_b = peVar1->ws;
  local_48._M_param._M_a = 1;
  if ((line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    factor = peVar1->factor;
    local_38 = &state->rng;
    uVar6 = 0;
    local_68 = this;
    local_40 = state;
    do {
      rVar3 = std::uniform_int_distribution<int>::operator()(&local_48,local_38,&local_48._M_param);
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (-1 < rVar3) {
        iVar7 = -rVar3;
        do {
          if ((iVar7 != 0) && (uVar4 = iVar7 + (int)uVar6, -1 < (int)uVar4)) {
            piVar2 = (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)uVar4 <
                (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2 >> 2)) {
              __x = Dictionary::getSubwords
                              ((local_68->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,piVar2[uVar4]);
              std::vector<int,_std::allocator<int>_>::vector(&local_60,__x);
              iVar5 = factor;
              if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start && 0 < factor) {
                do {
                  std::vector<int,_std::allocator<int>_>::insert
                            (&local_60,
                             (const_iterator)
                             local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
                  iVar5 = iVar5 + -1;
                } while (iVar5 != 0);
              }
              std::vector<int,std::allocator<int>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                        ((vector<int,std::allocator<int>> *)&local_88,
                         local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (value_type_conflict1 *)0x0) {
                operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
            }
          }
          bVar8 = iVar7 != rVar3;
          iVar7 = iVar7 + 1;
        } while (bVar8);
      }
      Model::update((local_68->model_).
                    super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_88
                    ,line,(int)uVar6,lr,local_40,factor);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void FastText::cbow(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::vector<int32_t> bow;
  std::uniform_int_distribution<> uniform(1, args_->ws);
  int factor = args_->factor;
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    bow.clear();
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w + c]);
        std::vector<int32_t> ngramsmod = ngrams;
        if (ngramsmod.size() > 0) {
            for (int i=0; i<factor; i++) ngramsmod.insert(ngramsmod.end(),ngramsmod[0]); //mod avg-pool to weighted-avg-pool
        }
        bow.insert(bow.end(), ngramsmod.cbegin(), ngramsmod.cend());
      }
    }
      model_->update(bow, line, w, lr, state, factor);
  }
}